

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Char * getContext(XML_Parser parser)

{
  STRING_POOL *pool;
  XML_Char XVar1;
  char cVar2;
  DTD *pDVar3;
  XML_Char *pXVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  XML_Bool XVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  NAMED **ppNVar13;
  NAMED **ppNVar14;
  NAMED *pNVar15;
  
  pDVar3 = parser->m_dtd;
  if ((pDVar3->defaultPrefix).binding == (BINDING *)0x0) {
    bVar7 = false;
  }
  else {
    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
       (XVar9 = poolGrow(&parser->m_tempPool), XVar9 == '\0')) {
LAB_005f9f25:
      bVar6 = false;
      bVar7 = false;
    }
    else {
      pXVar4 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar4 + 1;
      *pXVar4 = '=';
      uVar10 = ((pDVar3->defaultPrefix).binding)->uriLen + -1 +
               (uint)(parser->m_namespaceSeparator == '\0');
      if (0 < (int)uVar10) {
        uVar12 = 0;
        do {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar9 = poolGrow(&parser->m_tempPool), XVar9 == '\0')) goto LAB_005f9f25;
          XVar1 = ((pDVar3->defaultPrefix).binding)->uri[uVar12];
          pXVar4 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar4 + 1;
          *pXVar4 = XVar1;
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
      bVar6 = true;
      bVar7 = true;
    }
    if (!bVar6) {
      return (XML_Char *)0x0;
    }
  }
  ppNVar13 = (pDVar3->prefixes).v;
  if (ppNVar13 == (NAMED **)0x0) {
    ppNVar14 = (NAMED **)0x0;
  }
  else {
    ppNVar14 = ppNVar13 + (pDVar3->prefixes).size;
  }
  pool = &parser->m_tempPool;
LAB_005f9f5b:
  do {
    if (ppNVar13 == ppNVar14) {
      pNVar15 = (NAMED *)0x0;
    }
    else {
      pNVar15 = *ppNVar13;
      ppNVar13 = ppNVar13 + 1;
      if (pNVar15 == (NAMED *)0x0) goto LAB_005f9f5b;
    }
    if (pNVar15 == (NAMED *)0x0) {
      iVar11 = 5;
    }
    else if (pNVar15[1].name == (KEY)0x0) {
      iVar11 = 6;
    }
    else {
      if (bVar7) {
        if (((parser->m_tempPool).ptr != (parser->m_tempPool).end) ||
           (XVar9 = poolGrow(pool), XVar9 != '\0')) {
          pXVar4 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar4 + 1;
          *pXVar4 = '\f';
          goto LAB_005f9fc5;
        }
      }
      else {
LAB_005f9fc5:
        cVar2 = *pNVar15->name;
        pcVar8 = pNVar15->name;
        while (cVar2 != '\0') {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar9 = poolGrow(pool), XVar9 == '\0')) goto LAB_005fa0c3;
          cVar2 = *pcVar8;
          pcVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pcVar5 + 1;
          *pcVar5 = cVar2;
          cVar2 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        }
        if (((parser->m_tempPool).ptr != (parser->m_tempPool).end) ||
           (XVar9 = poolGrow(pool), XVar9 != '\0')) {
          pXVar4 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar4 + 1;
          *pXVar4 = '=';
          uVar10 = *(int *)(pNVar15[1].name + 0x28) + -1 +
                   (uint)(parser->m_namespaceSeparator == '\0');
          iVar11 = 0;
          if ((int)uVar10 < 1) {
            bVar7 = true;
          }
          else {
            uVar12 = 0;
            do {
              if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                 (XVar9 = poolGrow(pool), XVar9 == '\0')) {
                iVar11 = 1;
                goto LAB_005fa0d9;
              }
              XVar1 = *(XML_Char *)(*(long *)(pNVar15[1].name + 0x20) + uVar12);
              pXVar4 = (parser->m_tempPool).ptr;
              (parser->m_tempPool).ptr = pXVar4 + 1;
              *pXVar4 = XVar1;
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
            bVar7 = true;
            iVar11 = 0;
          }
          goto LAB_005fa0d9;
        }
      }
LAB_005fa0c3:
      iVar11 = 1;
    }
LAB_005fa0d9:
  } while ((iVar11 == 0) || (iVar11 == 6));
  if (iVar11 == 5) {
    ppNVar13 = (pDVar3->generalEntities).v;
    if (ppNVar13 == (NAMED **)0x0) {
      ppNVar14 = (NAMED **)0x0;
    }
    else {
      ppNVar14 = ppNVar13 + (pDVar3->generalEntities).size;
    }
LAB_005fa10d:
    do {
      if (ppNVar13 == ppNVar14) {
        pNVar15 = (NAMED *)0x0;
      }
      else {
        pNVar15 = *ppNVar13;
        ppNVar13 = ppNVar13 + 1;
        if (pNVar15 == (NAMED *)0x0) goto LAB_005fa10d;
      }
      if (pNVar15 == (NAMED *)0x0) {
        iVar11 = 0xd;
      }
      else if (*(char *)&pNVar15[7].name == '\0') {
        iVar11 = 0xe;
      }
      else {
        if (bVar7) {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar9 = poolGrow(pool), XVar9 == '\0')) {
LAB_005fa1d6:
            iVar11 = 1;
            goto LAB_005fa1db;
          }
          pXVar4 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar4 + 1;
          *pXVar4 = '\f';
        }
        iVar11 = 0;
        cVar2 = *pNVar15->name;
        pcVar8 = pNVar15->name;
        while (cVar2 != '\0') {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar9 = poolGrow(pool), XVar9 == '\0')) goto LAB_005fa1d6;
          cVar2 = *pcVar8;
          pcVar5 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pcVar5 + 1;
          *pcVar5 = cVar2;
          cVar2 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        }
        bVar7 = true;
      }
LAB_005fa1db:
    } while ((iVar11 == 0) || (iVar11 == 0xe));
    if ((iVar11 == 0xd) &&
       (((parser->m_tempPool).ptr != (parser->m_tempPool).end ||
        (XVar9 = poolGrow(pool), XVar9 != '\0')))) {
      pXVar4 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar4 + 1;
      *pXVar4 = '\0';
      return (parser->m_tempPool).start;
    }
  }
  return (XML_Char *)0x0;
}

Assistant:

static const XML_Char *
getContext(XML_Parser parser) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  HASH_TABLE_ITER iter;
  XML_Bool needSep = XML_FALSE;

  if (dtd->defaultPrefix.binding) {
    int i;
    int len;
    if (! poolAppendChar(&parser->m_tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = dtd->defaultPrefix.binding->uriLen;
    if (parser->m_namespaceSeparator)
      len--;
    for (i = 0; i < len; i++) {
      if (! poolAppendChar(&parser->m_tempPool,
                           dtd->defaultPrefix.binding->uri[i])) {
        /* Because of memory caching, I don't believe this line can be
         * executed.
         *
         * This is part of a loop copying the default prefix binding
         * URI into the parser's temporary string pool.  Previously,
         * that URI was copied into the same string pool, with a
         * terminating NUL character, as part of setContext().  When
         * the pool was cleared, that leaves a block definitely big
         * enough to hold the URI on the free block list of the pool.
         * The URI copy in getContext() therefore cannot run out of
         * memory.
         *
         * If the pool is used between the setContext() and
         * getContext() calls, the worst it can do is leave a bigger
         * block on the front of the free list.  Given that this is
         * all somewhat inobvious and program logic can be changed, we
         * don't delete the line but we do exclude it from the test
         * coverage statistics.
         */
        return NULL; /* LCOV_EXCL_LINE */
      }
    }
    needSep = XML_TRUE;
  }

  hashTableIterInit(&iter, &(dtd->prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (! prefix)
      break;
    if (! prefix->binding) {
      /* This test appears to be (justifiable) paranoia.  There does
       * not seem to be a way of injecting a prefix without a binding
       * that doesn't get errored long before this function is called.
       * The test should remain for safety's sake, so we instead
       * exclude the following line from the coverage statistics.
       */
      continue; /* LCOV_EXCL_LINE */
    }
    if (needSep && ! poolAppendChar(&parser->m_tempPool, CONTEXT_SEP))
      return NULL;
    for (s = prefix->name; *s; s++)
      if (! poolAppendChar(&parser->m_tempPool, *s))
        return NULL;
    if (! poolAppendChar(&parser->m_tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = prefix->binding->uriLen;
    if (parser->m_namespaceSeparator)
      len--;
    for (i = 0; i < len; i++)
      if (! poolAppendChar(&parser->m_tempPool, prefix->binding->uri[i]))
        return NULL;
    needSep = XML_TRUE;
  }

  hashTableIterInit(&iter, &(dtd->generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (! e)
      break;
    if (! e->open)
      continue;
    if (needSep && ! poolAppendChar(&parser->m_tempPool, CONTEXT_SEP))
      return NULL;
    for (s = e->name; *s; s++)
      if (! poolAppendChar(&parser->m_tempPool, *s))
        return 0;
    needSep = XML_TRUE;
  }

  if (! poolAppendChar(&parser->m_tempPool, XML_T('\0')))
    return NULL;
  return parser->m_tempPool.start;
}